

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O3

void qpixl::frqi::isfwht<std::vector<float,std::allocator<float>>>
               (vector<float,_std::allocator<float>_> *a)

{
  float fVar1;
  pointer pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  pfVar2 = (a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  uVar3 = (long)(a->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish - (long)pfVar2 >> 2;
  uVar4 = uVar3 - (uVar3 >> 1 & 0x5555555555555555);
  uVar4 = (uVar4 >> 2 & 0x3333333333333333) + (uVar4 & 0x3333333333333333);
  uVar4 = ((uVar4 >> 4) + uVar4 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101;
  if (1 < uVar4 >> 0x38) {
    __assert_fail("qpixl::ispow2( n )",
                  "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/include/qpixl/frqi/util.hpp"
                  ,0x36,"void qpixl::frqi::isfwht(V &) [V = std::vector<float>]");
  }
  if ((char)(uVar4 >> 0x38) == '\x01') {
    if (1 < uVar3) {
      uVar4 = 1;
      do {
        uVar5 = 0;
        do {
          if ((uVar5 & uVar4) == 0) {
            fVar1 = pfVar2[uVar5];
            pfVar2[uVar5] = pfVar2[uVar4 + uVar5] + fVar1;
            pfVar2[uVar4 + uVar5] = fVar1 - pfVar2[uVar4 + uVar5];
          }
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        uVar4 = uVar4 * 2;
      } while (uVar4 < uVar3);
    }
    return;
  }
  __assert_fail("std::popcount( x ) == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/include/qpixl/util.hpp"
                ,0x13,"size_t qpixl::ilog2(const size_t)");
}

Assistant:

void isfwht( V& a ) {
    using T = typename V::value_type ;
    size_t n = a.size() ;
    assert( qpixl::ispow2( n ) ) ;
    size_t k = qpixl::ilog2( n ) ;

    for ( size_t j = 1; j < n; j*=2 ) {
      #pragma omp parallel for
      for ( size_t i = 0; i < n; i++ ) {
        if ( ( i & j ) == 0 ) {
          const size_t j1 = i + j ;
          const T x = a[i] ;

          a[i]  = ( a[i] + a[j1] ) ;
          a[j1] = ( x    - a[j1] ) ;
        }
      }
    }
  }